

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

int64 __thiscall google::protobuf::io::StringOutputStream::ByteCount(StringOutputStream *this)

{
  LogMessage *other;
  int64 iVar1;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  StringOutputStream *local_10;
  StringOutputStream *this_local;
  
  local_49 = 0;
  local_10 = this;
  if (this->target_ == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xc6);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  iVar1 = std::__cxx11::string::size();
  return iVar1;
}

Assistant:

int64 StringOutputStream::ByteCount() const {
  GOOGLE_CHECK(target_ != NULL);
  return target_->size();
}